

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortByPTypeProcess.cpp
# Opt level: O2

void UpdateNodes(vector<unsigned_int,_std::allocator<unsigned_int>_> *replaceMeshIndex,aiNode *node)

{
  uint uVar1;
  uint uVar2;
  uint m_1;
  uint *puVar3;
  uint m;
  ulong uVar4;
  uint newSize;
  uint uVar5;
  long lVar6;
  uint m_2;
  ulong uVar7;
  
  uVar7 = (ulong)node->mNumMeshes;
  if (uVar7 != 0) {
    puVar3 = node->mMeshes;
    uVar5 = 0;
    for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        uVar5 = uVar5 + ((replaceMeshIndex->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start[(ulong)(puVar3[uVar4] << 2) + lVar6] !=
                        0xffffffff);
      }
    }
    if (uVar5 == 0) {
      if (puVar3 != (uint *)0x0) {
        operator_delete__(puVar3);
      }
      node->mNumMeshes = 0;
      puVar3 = (uint *)0x0;
    }
    else {
      if (node->mNumMeshes < uVar5) {
        puVar3 = (uint *)operator_new__((ulong)uVar5 * 4);
      }
      for (uVar4 = 0; uVar4 < uVar7; uVar4 = uVar4 + 1) {
        uVar1 = node->mMeshes[uVar4];
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          uVar2 = (replaceMeshIndex->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  )._M_impl.super__Vector_impl_data._M_start[(ulong)(uVar1 << 2) + lVar6];
          if (uVar2 != 0xffffffff) {
            *puVar3 = uVar2;
            puVar3 = puVar3 + 1;
          }
        }
        uVar7 = (ulong)node->mNumMeshes;
      }
      if (((uint)uVar7 < uVar5) && (node->mMeshes != (uint *)0x0)) {
        operator_delete__(node->mMeshes);
      }
      node->mNumMeshes = uVar5;
      puVar3 = puVar3 + -(ulong)uVar5;
    }
    node->mMeshes = puVar3;
  }
  for (uVar7 = 0; uVar7 < node->mNumChildren; uVar7 = uVar7 + 1) {
    UpdateNodes(replaceMeshIndex,node->mChildren[uVar7]);
  }
  return;
}

Assistant:

void UpdateNodes(const std::vector<unsigned int>& replaceMeshIndex, aiNode* node)
{
    if (node->mNumMeshes)
    {
        unsigned int newSize = 0;
        for (unsigned int m = 0; m< node->mNumMeshes; ++m)
        {
            unsigned int add = node->mMeshes[m]<<2;
            for (unsigned int i = 0; i < 4;++i)
            {
                if (UINT_MAX != replaceMeshIndex[add+i])++newSize;
            }
        }
        if (!newSize)
        {
            delete[] node->mMeshes;
            node->mNumMeshes = 0;
            node->mMeshes    = NULL;
        }
        else
        {
            // Try to reuse the old array if possible
            unsigned int* newMeshes = (newSize > node->mNumMeshes
                ? new unsigned int[newSize] : node->mMeshes);

            for (unsigned int m = 0; m< node->mNumMeshes; ++m)
            {
                unsigned int add = node->mMeshes[m]<<2;
                for (unsigned int i = 0; i < 4;++i)
                {
                    if (UINT_MAX != replaceMeshIndex[add+i])
                        *newMeshes++ = replaceMeshIndex[add+i];
                }
            }
            if (newSize > node->mNumMeshes)
                delete[] node->mMeshes;

            node->mMeshes = newMeshes-(node->mNumMeshes = newSize);
        }
    }

    // call all subnodes recursively
    for (unsigned int m = 0; m < node->mNumChildren; ++m)
        UpdateNodes(replaceMeshIndex,node->mChildren[m]);
}